

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void google::InstallFailureSignalHandler(void)

{
  int iVar1;
  ostream *poVar2;
  SendMethod in_R9;
  LogMessage local_c0;
  LogMessageVoidify local_a9;
  ulong local_a8;
  size_t i;
  sigaction sig_action;
  
  memset(&i,0,0x98);
  sigemptyset((sigset_t *)&sig_action);
  sig_action.sa_mask.__val[0xf]._0_4_ = (uint)sig_action.sa_mask.__val[0xf] | 4;
  i = (size_t)anon_unknown_0::FailureSignalHandler;
  for (local_a8 = 0; local_a8 < 6; local_a8 = local_a8 + 1) {
    iVar1 = sigaction(*(int *)((anonymous_namespace)::kFailureSignals + local_a8 * 0x10),
                      (sigaction *)&i,(sigaction *)0x0);
    if (iVar1 == -1) {
      LogMessageVoidify::LogMessageVoidify(&local_a9);
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/signalhandler.cc"
                 ,0x181,3,0,in_R9);
      poVar2 = LogMessage::stream(&local_c0);
      poVar2 = std::operator<<(poVar2,"sigaction(kFailureSignals[i].number, &sig_action, NULL)");
      LogMessageVoidify::operator&(&local_a9,poVar2);
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_c0);
    }
  }
  (anonymous_namespace)::kFailureSignalHandlerInstalled = 1;
  return;
}

Assistant:

void InstallFailureSignalHandler() {
#ifdef HAVE_SIGACTION
  // Build the sigaction struct.
  struct sigaction sig_action;
  memset(&sig_action, 0, sizeof(sig_action));
  sigemptyset(&sig_action.sa_mask);
  sig_action.sa_flags |= SA_SIGINFO;
  sig_action.sa_sigaction = &FailureSignalHandler;

  for (size_t i = 0; i < ARRAYSIZE(kFailureSignals); ++i) {
    CHECK_ERR(sigaction(kFailureSignals[i].number, &sig_action, NULL));
  }
  kFailureSignalHandlerInstalled = true;
#elif defined(OS_WINDOWS)
  for (size_t i = 0; i < ARRAYSIZE(kFailureSignals); ++i) {
    CHECK_NE(signal(kFailureSignals[i].number, &FailureSignalHandler),
             SIG_ERR);
  }
  kFailureSignalHandlerInstalled = true;
#endif  // HAVE_SIGACTION
}